

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::xfer_spi(Spi *this,uint8_t *data,int n)

{
  BYTE BVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  DWORD dwNumBytesSent;
  
  if (n < 1) {
    return;
  }
  send_byte(this,'1');
  send_byte(this,(uint8_t)(n + -1));
  send_byte(this,(uint8_t)((uint)(n + -1) >> 8));
  iVar2 = FT_Write(this->ftHandle,data,n);
  if (iVar2 == 0) {
    if (n == 0) {
      for (lVar4 = 0; lVar4 != 0; lVar4 = lVar4 + 1) {
        BVar1 = recv_byte(this);
        data[lVar4] = BVar1;
      }
      return;
    }
    fprintf(_stderr,"Write error (chunk, rc=%u, expected %d).\n",0,(ulong)(uint)n);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Write error!");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  error(this,2);
}

Assistant:

void Spi::xfer_spi(uint8_t *data, int n) {
	if (n < 1)
		return;

	/* Input and output, update data on negative edge read on positive. */
	send_byte(MC_DATA_IN | MC_DATA_OUT | MC_DATA_OCN);
	send_byte(n - 1);
	send_byte((n - 1) >> 8);

	FT_STATUS ftStatus;
	DWORD dwNumBytesSent = 0;

	ftStatus = FT_Write(ftHandle, data, n, &dwNumBytesSent);
	if (ftStatus != FT_OK) {
		cerr << "Write error!" << endl;
		error(2);
	}

	if (dwNumBytesSent != (unsigned int) n) {
		fprintf(stderr, "Write error (chunk, rc=%u, expected %d).\n",
				dwNumBytesSent, n);
		error(2);
	}

	for (int i = 0; i < n; i++)
		data[i] = recv_byte();
}